

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aistr.cpp
# Opt level: O3

void __thiscall Test_aistr_append_Test::TestBody(Test_aistr_append_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  char buf [10];
  AssertHelper local_48;
  AssertHelper local_40;
  Message local_38;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  char local_28 [16];
  
  local_28[8] = '\0';
  local_28[9] = '\0';
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    ai::append<10ul>((char (*) [10])local_28,(char *)0x0);
  }
  testing::Message::Message(&local_38);
  testing::internal::AssertHelper::AssertHelper
            (&local_48,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
             ,0x6b,
             "Expected: ai::append(buf, nullptr) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_48,&local_38);
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  if (CONCAT71(local_38.ss_.ptr_._1_7_,local_38.ss_.ptr_._0_1_) != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((long *)CONCAT71(local_38.ss_.ptr_._1_7_,local_38.ss_.ptr_._0_1_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_38.ss_.ptr_._1_7_,local_38.ss_.ptr_._0_1_) + 8))();
    }
  }
  ai::append<10ul>((char (*) [10])local_28,"1234");
  ai::checkPointerNotNull("1234");
  local_48.data_._0_4_ = strncmp(local_28,"1234",10);
  local_40.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_38,"ai::compare(buf, \"1234\")","0",(int *)&local_48,
             (int *)&local_40);
  if (local_38.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (CONCAT44(local_48.data_._4_4_,(int)local_48.data_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(local_48.data_._4_4_,(int)local_48.data_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_48.data_._4_4_,(int)local_48.data_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar2 = "";
    ai::append<10ul>((char (*) [10])local_28,"");
    ai::checkPointerNotNull("1234");
    local_48.data_._0_4_ = strncmp(local_28,"1234",10);
    local_40.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_38,"ai::compare(buf, \"1234\")","0",(int *)&local_48,
               (int *)&local_40);
    if (local_38.ss_.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      if (local_30.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                 ,0x71,pcVar2);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (CONCAT44(local_48.data_._4_4_,(int)local_48.data_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && ((long *)CONCAT44(local_48.data_._4_4_,(int)local_48.data_) != (long *)0x0))
        {
          (**(code **)(*(long *)CONCAT44(local_48.data_._4_4_,(int)local_48.data_) + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      ai::append<10ul>((char (*) [10])local_28,"5678");
      ai::checkPointerNotNull("12345678");
      local_48.data_._0_4_ = strncmp(local_28,"12345678",10);
      local_40.data_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_38,"ai::compare(buf, \"12345678\")","0",(int *)&local_48,
                 (int *)&local_40);
      if (local_38.ss_.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        if (local_30.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                   ,0x74,pcVar2);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_40);
        if (CONCAT44(local_48.data_._4_4_,(int)local_48.data_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && ((long *)CONCAT44(local_48.data_._4_4_,(int)local_48.data_) != (long *)0x0)
             ) {
            (**(code **)(*(long *)CONCAT44(local_48.data_._4_4_,(int)local_48.data_) + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        ai::append<10ul>((char (*) [10])local_28,"9");
        ai::checkPointerNotNull("123456789");
        local_48.data_._0_4_ = strncmp(local_28,"123456789",10);
        local_40.data_._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_38,"ai::compare(buf, \"123456789\")","0",(int *)&local_48,
                   (int *)&local_40);
        if (local_38.ss_.ptr_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_48);
          if (local_30.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_40,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                     ,0x77,pcVar2);
          testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
          testing::internal::AssertHelper::~AssertHelper(&local_40);
          if (CONCAT44(local_48.data_._4_4_,(int)local_48.data_) != 0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               ((long *)CONCAT44(local_48.data_._4_4_,(int)local_48.data_) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(local_48.data_._4_4_,(int)local_48.data_) + 8))();
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          ai::append<10ul>((char (*) [10])local_28,"01");
          ai::checkPointerNotNull("123456789");
          local_48.data_._0_4_ = strncmp(local_28,"123456789",10);
          local_40.data_._0_4_ = 0;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&local_38,"ai::compare(buf, \"123456789\")","0",(int *)&local_48,
                     (int *)&local_40);
          if (local_38.ss_.ptr_._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_48);
            if (local_30.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_40,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                       ,0x7a,pcVar2);
            testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
            testing::internal::AssertHelper::~AssertHelper(&local_40);
            if (CONCAT44(local_48.data_._4_4_,(int)local_48.data_) != 0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) &&
                 ((long *)CONCAT44(local_48.data_._4_4_,(int)local_48.data_) != (long *)0x0)) {
                (**(code **)(*(long *)CONCAT44(local_48.data_._4_4_,(int)local_48.data_) + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(Test_aistr, append) {
    char buf[10] = {0};

    EXPECT_THROW(ai::append(buf, nullptr), std::invalid_argument);

    ai::append(buf, "1234");
    ASSERT_EQ(ai::compare(buf, "1234"), 0);

    ai::append(buf, "");
    ASSERT_EQ(ai::compare(buf, "1234"), 0);

    ai::append(buf, "5678");
    ASSERT_EQ(ai::compare(buf, "12345678"), 0);

    ai::append(buf, "9");
    ASSERT_EQ(ai::compare(buf, "123456789"), 0);

    ai::append(buf, "01");
    ASSERT_EQ(ai::compare(buf, "123456789"), 0);
}